

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPAffinityClause::generateDOT
          (OpenMPAffinityClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  pointer ppcVar1;
  allocator<char> local_1e9;
  ofstream *local_1e8;
  int local_1dc;
  string node_id;
  string local_1b8;
  OpenMPAffinityClause *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string parameter_string;
  string indent;
  string current_line;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_1e8 = dot_file;
  local_198 = this;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&local_170,depth);
  std::operator+(&node_id,"affinity_",&local_170);
  std::operator+(&parameter_string,&node_id,"_");
  std::__cxx11::to_string(&local_1b8,index);
  std::operator+(&clause_kind,&parameter_string,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_170);
  std::operator+(&local_1b8,&indent,parent_node);
  std::operator+(&local_170,&local_1b8,"-- ");
  std::operator+(&node_id,&local_170,&clause_kind);
  std::operator+(&parameter_string,&node_id,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  if (local_198->modifier == OMPC_AFFINITY_MODIFIER_iterator) {
    std::__cxx11::string::assign((char *)&parameter_string);
    if (parameter_string._M_string_length != 0) {
      std::operator+(&node_id,&clause_kind,"_modifier");
      std::operator+(&local_190,&indent,&clause_kind);
      std::operator+(&local_150,&local_190," -- ");
      std::operator+(&local_1b8,&local_150,&node_id);
      std::operator+(&local_170,&local_1b8,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_190);
      std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
      std::operator+(&local_b0,&indent,"\t");
      std::operator+(&local_90,&local_b0,&node_id);
      std::operator+(&local_70,&local_90," [label = \"");
      std::operator+(&local_190,&local_70,&node_id);
      std::operator+(&local_150,&local_190,"\\n ");
      std::operator+(&local_1b8,&local_150,&parameter_string);
      std::operator+(&local_170,&local_1b8,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&node_id);
    }
  }
  node_id._M_dataplus._M_p = (pointer)&node_id.field_2;
  node_id._M_string_length = 0;
  node_id.field_2._M_local_buf[0] = '\0';
  ppcVar1 = (local_198->super_OpenMPClause).expressions.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1dc = 0;
  for (; ppcVar1 !=
         (local_198->super_OpenMPClause).expressions.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    std::operator+(&local_1b8,&clause_kind,"_expr");
    std::__cxx11::to_string(&local_150,local_1dc);
    std::operator+(&local_170,&local_1b8,&local_150);
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::operator+(&local_190,&indent,&clause_kind);
    std::operator+(&local_150,&local_190," -- ");
    std::operator+(&local_1b8,&local_150,&node_id);
    std::operator+(&local_170,&local_1b8,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_190);
    std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
    std::operator+(&local_b0,&indent,"\t");
    std::operator+(&local_90,&local_b0,&node_id);
    std::operator+(&local_70,&local_90," [label = \"");
    std::operator+(&local_190,&local_70,&node_id);
    std::operator+(&local_150,&local_190,"\\n ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar1,&local_1e9);
    std::operator+(&local_1b8,&local_150,&local_50);
    std::operator+(&local_170,&local_1b8,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
    local_1dc = local_1dc + 1;
  }
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPAffinityClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "affinity_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPAffinityClauseModifier modifier = this->getModifier();
    std::string parameter_string;
    switch (modifier) {
        case OMPC_AFFINITY_MODIFIER_iterator:
            parameter_string = "iterator";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_modifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
 std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}